

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

int cuddHashTableInsert(DdHashTable *hash,DdNodePtr *key,DdNode *value,ptrint count)

{
  int *piVar1;
  uint uVar2;
  DdHashItem **ppDVar3;
  int iVar4;
  DdHashItem *pDVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (hash->maxsize < hash->size) {
    cuddHashTableResize(hash);
  }
  pDVar5 = cuddHashTableAlloc(hash);
  if (pDVar5 == (DdHashItem *)0x0) {
    iVar4 = 0;
  }
  else {
    hash->size = hash->size + 1;
    pDVar5->value = value;
    piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5->count = count;
    uVar2 = hash->keysize;
    uVar8 = (ulong)uVar2;
    if (uVar8 == 0) {
      bVar6 = (byte)hash->shift;
      uVar9 = *(int *)key * 0x40f1f9;
    }
    else {
      uVar7 = 0;
      do {
        pDVar5->key[uVar7] = key[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      bVar6 = (byte)hash->shift;
      uVar9 = *(int *)key * 0x40f1f9;
      if (uVar2 != 1) {
        uVar7 = 1;
        do {
          uVar9 = uVar9 * 0xc00005 + *(int *)(key + uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    uVar9 = uVar9 >> (bVar6 & 0x1f);
    ppDVar3 = hash->bucket;
    pDVar5->next = ppDVar3[uVar9];
    ppDVar3[uVar9] = pDVar5;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
cuddHashTableInsert(
  DdHashTable * hash,
  DdNodePtr * key,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;
    unsigned int i;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    for (i = 0; i < hash->keysize; i++) {
        item->key[i] = key[i];
    }
    posn = ddLCHash(key,hash->keysize,hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}